

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paseto_v2_local.c
# Opt level: O0

uint8_t * paseto_v2_local_decrypt
                    (char *encoded,size_t *message_len,uint8_t *key,uint8_t **footer,
                    size_t *footer_len)

{
  char *data;
  _Bool _Var1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  void *__dest;
  undefined8 in_stack_ffffffffffffff30;
  undefined4 uVar5;
  uint8_t *internal_footer;
  unsigned_long_long internal_message_len;
  unsigned_long_long ct_len;
  uint8_t *ct;
  uint8_t *message;
  size_t pre_auth_len;
  pre_auth pa;
  size_t decoded_footer_len;
  uint8_t *decoded_footer;
  size_t encoded_footer_len;
  uint8_t *nonce;
  char *encoded_footer;
  uint8_t *decoded;
  size_t decoded_len;
  size_t encoded_len;
  size_t *footer_len_local;
  uint8_t **footer_local;
  uint8_t *key_local;
  size_t *message_len_local;
  char *encoded_local;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  encoded_len = (size_t)footer_len;
  footer_len_local = (size_t *)footer;
  footer_local = (uint8_t **)key;
  key_local = (uint8_t *)message_len;
  message_len_local = (size_t *)encoded;
  if (((encoded == (char *)0x0) || (message_len == (size_t *)0x0)) || (key == (uint8_t *)0x0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    encoded_local = (char *)0x0;
  }
  else {
    sVar4 = strlen(encoded);
    if ((sVar4 < 0x3f) || (iVar2 = memcmp(message_len_local,"v2.local.",9), iVar2 != 0)) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      encoded_local = (char *)0x0;
    }
    else {
      message_len_local = (size_t *)((long)message_len_local + 9);
      decoded_len = strlen((char *)message_len_local);
      encoded_footer = (char *)malloc(decoded_len);
      if (encoded_footer == (char *)0x0) {
        piVar3 = __errno_location();
        *piVar3 = 0xc;
        encoded_local = (char *)0x0;
      }
      else {
        iVar2 = sodium_base642bin(encoded_footer,decoded_len,message_len_local,decoded_len,0,
                                  &decoded,&nonce,CONCAT44(uVar5,7));
        data = encoded_footer;
        if (iVar2 == 0) {
          if (decoded_len < 0x28) {
            free(encoded_footer);
            piVar3 = __errno_location();
            *piVar3 = 0x16;
            encoded_local = (char *)0x0;
          }
          else {
            sVar4 = strlen((char *)nonce);
            decoded_footer_len = 0;
            pa.current = (uint8_t *)0x0;
            if (1 < sVar4) {
              nonce = nonce + 1;
              decoded_footer_len = (size_t)(encoded_footer + (long)decoded);
              iVar2 = sodium_base642bin(decoded_footer_len,decoded_len - (long)decoded,nonce,
                                        sVar4 - 1,0,&pa.current,0,7);
              if (iVar2 != 0) {
                free(encoded_footer);
                piVar3 = __errno_location();
                *piVar3 = 0x16;
                return (uint8_t *)0x0;
              }
            }
            _Var1 = pre_auth_init((pre_auth *)&pre_auth_len,3,(size_t)(pa.current + 0x21));
            if (_Var1) {
              pre_auth_append((pre_auth *)&pre_auth_len,"v2.local.",9);
              pre_auth_append((pre_auth *)&pre_auth_len,(uint8_t *)data,0x18);
              pre_auth_append((pre_auth *)&pre_auth_len,(uint8_t *)decoded_footer_len,
                              (size_t)pa.current);
              message = pa.base + -pre_auth_len;
              ct = (uint8_t *)malloc((size_t)(decoded + -0xf));
              if (ct == (uint8_t *)0x0) {
                free(encoded_footer);
                free((void *)pre_auth_len);
                piVar3 = __errno_location();
                *piVar3 = 0xc;
                encoded_local = (char *)0x0;
              }
              else {
                ct_len = (unsigned_long_long)(encoded_footer + 0x18);
                internal_message_len = (unsigned_long_long)(decoded + -0x18);
                iVar2 = crypto_aead_xchacha20poly1305_ietf_decrypt
                                  (ct,&internal_footer,0,ct_len,internal_message_len,pre_auth_len,
                                   message,data,footer_local);
                if (iVar2 == 0) {
                  ct[(long)internal_footer] = '\0';
                  free((void *)pre_auth_len);
                  if (((decoded_footer_len == 0) || (footer_len_local == (size_t *)0x0)) ||
                     (encoded_len == 0)) {
                    if (footer_len_local != (size_t *)0x0) {
                      *footer_len_local = 0;
                    }
                    if (encoded_len != 0) {
                      *(undefined8 *)encoded_len = 0;
                    }
                  }
                  else {
                    __dest = malloc((size_t)(pa.current + 1));
                    if (__dest == (void *)0x0) {
                      free(encoded_footer);
                      free(ct);
                      piVar3 = __errno_location();
                      *piVar3 = 0xc;
                      return (uint8_t *)0x0;
                    }
                    memcpy(__dest,(void *)decoded_footer_len,(size_t)pa.current);
                    *(uint8_t *)((long)__dest + (long)pa.current) = '\0';
                    *footer_len_local = (size_t)__dest;
                    *(uint8_t **)encoded_len = pa.current;
                  }
                  free(encoded_footer);
                  *(uint8_t **)key_local = internal_footer;
                  encoded_local = (char *)ct;
                }
                else {
                  free(encoded_footer);
                  free((void *)pre_auth_len);
                  free(ct);
                  piVar3 = __errno_location();
                  *piVar3 = 0x16;
                  encoded_local = (char *)0x0;
                }
              }
            }
            else {
              free(encoded_footer);
              piVar3 = __errno_location();
              *piVar3 = 0xc;
              encoded_local = (char *)0x0;
            }
          }
        }
        else {
          free(encoded_footer);
          piVar3 = __errno_location();
          *piVar3 = 0x16;
          encoded_local = (char *)0x0;
        }
      }
    }
  }
  return (uint8_t *)encoded_local;
}

Assistant:

uint8_t *paseto_v2_local_decrypt(
        const char *encoded, size_t *message_len,
        const uint8_t key[paseto_v2_LOCAL_KEYBYTES],
        uint8_t **footer, size_t *footer_len) {
    if (!encoded || !message_len || !key) {
        errno = EINVAL;
        return NULL;
    }

    if (strlen(encoded) < header_len + sodium_base64_ENCODED_LEN(
                paseto_v2_LOCAL_NONCEBYTES + mac_len,
                sodium_base64_VARIANT_URLSAFE_NO_PADDING) - 1
            || memcmp(encoded, header, header_len) != 0) {
        errno = EINVAL;
        return NULL;
    }

    encoded += header_len;

    const size_t encoded_len = strlen(encoded);
    size_t decoded_len;
    uint8_t *decoded = malloc(encoded_len);
    if (!decoded) {
        errno = ENOMEM;
        return NULL;
    }

    const char *encoded_footer;
    if (sodium_base642bin(
            decoded, encoded_len,
            encoded, encoded_len,
            NULL, &decoded_len,
            &encoded_footer,
            sodium_base64_VARIANT_URLSAFE_NO_PADDING) != 0) {
        free(decoded);
        errno = EINVAL;
        return NULL;
    }

    const uint8_t *nonce = decoded;
    // after base64 decoding there should be at least enough data to store the
    // nonce as well as the signature
    if (encoded_len < paseto_v2_LOCAL_NONCEBYTES + mac_len) {
        free(decoded);
        errno = EINVAL;
        return NULL;
    }

    size_t encoded_footer_len = strlen(encoded_footer);
    uint8_t *decoded_footer = NULL;
    size_t decoded_footer_len = 0;

    if (encoded_footer_len > 1) {
        // footer present and one or more bytes long
        // skip '.'
        encoded_footer_len--;
        encoded_footer++;

        // use memory after the decoded data for the decoded footer
        decoded_footer = decoded + decoded_len;

        if (sodium_base642bin(
                decoded_footer, encoded_len - decoded_len,
                encoded_footer, encoded_footer_len,
                NULL, &decoded_footer_len,
                NULL,
                sodium_base64_VARIANT_URLSAFE_NO_PADDING) != 0) {
            free(decoded);
            errno = EINVAL;
            return NULL;
        }
    }

    struct pre_auth pa;
    if (!pre_auth_init(&pa, 3,
            header_len + paseto_v2_LOCAL_NONCEBYTES + decoded_footer_len)) {
        free(decoded);
        errno = ENOMEM;
        return NULL;
    }
    pre_auth_append(&pa, header, header_len);
    pre_auth_append(&pa, nonce, paseto_v2_LOCAL_NONCEBYTES);
    pre_auth_append(&pa, decoded_footer, decoded_footer_len);
    const size_t pre_auth_len = pa.current - pa.base;


    uint8_t *message = malloc(decoded_len - mac_len + 1);
    if (!message) {
        free(decoded);
        free(pa.base);
        errno = ENOMEM;
        return NULL;
    }
    uint8_t *ct = decoded + paseto_v2_LOCAL_NONCEBYTES;
    const unsigned long long ct_len = decoded_len - paseto_v2_LOCAL_NONCEBYTES;
    unsigned long long internal_message_len;
    if (crypto_aead_xchacha20poly1305_ietf_decrypt(
            message, &internal_message_len,
            NULL,
            ct, ct_len,
            pa.base, pre_auth_len,
            nonce, key) != 0) {
        free(decoded);
        free(pa.base);
        free(message);
        errno = EINVAL;
        return NULL;
    }

    // include a null terminator for convenience
    message[internal_message_len] = '\0';

    free(pa.base);

    if (decoded_footer && footer && footer_len) {
        uint8_t *internal_footer = malloc(decoded_footer_len + 1);
        if (!internal_footer) {
            free(decoded);
            free(message);
            errno = ENOMEM;
            return NULL;
        }
        memcpy(internal_footer, decoded_footer, decoded_footer_len);
        internal_footer[decoded_footer_len] = '\0';
        *footer = internal_footer;
        *footer_len = decoded_footer_len;
    } else {
        if (footer) *footer = NULL;
        if (footer_len) *footer_len = 0;
    }

    free(decoded);

    *message_len = internal_message_len;

    return message;
}